

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSAtom JS_DupAtom(JSContext *ctx,JSAtom v)

{
  JSAtomStruct *pJVar1;
  
  if (0xd1 < (int)v) {
    pJVar1 = ctx->rt->atom_array[v];
    (pJVar1->header).ref_count = (pJVar1->header).ref_count + 1;
  }
  return v;
}

Assistant:

JSAtom JS_DupAtom(JSContext *ctx, JSAtom v)
{
    JSRuntime *rt;
    JSAtomStruct *p;

    if (!__JS_AtomIsConst(v)) {
        rt = ctx->rt;
        p = rt->atom_array[v];
        p->header.ref_count++;
    }
    return v;
}